

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O3

int signature_compare(signature s,type_id ret,type_id *args,size_t size)

{
  type_id tVar1;
  int iVar2;
  ulong uVar3;
  type_conflict t;
  size_t *psVar4;
  
  iVar2 = 1;
  if (((s != (signature)0x0) && (s->count == size)) && (tVar1 = type_index(s->ret), tVar1 == ret)) {
    if (size != 0) {
      psVar4 = &s[1].count;
      uVar3 = 0;
      do {
        if (uVar3 < s->count) {
          t = (type_conflict)*psVar4;
        }
        else {
          t = (type_conflict)0x0;
        }
        iVar2 = args[uVar3];
        tVar1 = type_index(t);
        if (iVar2 != tVar1) {
          return 1;
        }
        uVar3 = uVar3 + 1;
        psVar4 = psVar4 + 3;
      } while (size != uVar3);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int signature_compare(signature s, type_id ret, type_id args[], size_t size)
{
	size_t iterator;

	if (s == NULL)
	{
		return 1;
	}

	if (s->count != size)
	{
		return 1;
	}

	if (type_index(s->ret) != ret)
	{
		return 1;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		type t = signature_get_type(s, iterator);

		if (args[iterator] != type_index(t))
		{
			return 1;
		}
	}

	return 0;
}